

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trun.c
# Opt level: O0

int do_code(C_MemoryAllocator *allocator,char *code,arguments *args)

{
  FILE *pFVar1;
  CompilerState *compiler_state_00;
  size_t sVar2;
  undefined8 uVar3;
  long lVar4;
  LinearizerState *linearizer;
  CompilerState *compiler_state;
  int rc;
  arguments *args_local;
  char *code_local;
  C_MemoryAllocator *allocator_local;
  
  if ((*(ushort *)&args->field_0x10 >> 8 & 1) != 0) {
    fprintf(_stdout,"#if 0\n");
  }
  if ((*(ushort *)&args->field_0x10 >> 5 & 1) != 0) {
    printf("%s\n",code);
  }
  compiler_state_00 = (CompilerState *)raviX_init_compiler(allocator);
  sVar2 = strlen(code);
  compiler_state._4_4_ = raviX_parse(compiler_state_00,code,sVar2,"input");
  pFVar1 = _stderr;
  if (compiler_state._4_4_ == 0) {
    output_ast(compiler_state_00,args);
    compiler_state._4_4_ = raviX_ast_lower(compiler_state_00);
    pFVar1 = _stderr;
    if (compiler_state._4_4_ == 0) {
      compiler_state._4_4_ = raviX_ast_typecheck(compiler_state_00);
      pFVar1 = _stderr;
      if (compiler_state._4_4_ == 0) {
        output_ast(compiler_state_00,args);
        if ((*(ushort *)&args->field_0x10 >> 6 & 1) != 0) {
          compiler_state._4_4_ = raviX_ast_simplify(compiler_state_00);
          pFVar1 = _stderr;
          if (compiler_state._4_4_ != 0) {
            uVar3 = raviX_get_last_error(compiler_state_00);
            fprintf(pFVar1,"%s\n",uVar3);
            goto LAB_00102ab4;
          }
          output_ast(compiler_state_00,args);
        }
        lVar4 = raviX_init_linearizer(compiler_state_00);
        compiler_state._4_4_ = raviX_ast_linearize(lVar4);
        pFVar1 = _stderr;
        if (compiler_state._4_4_ == 0) {
          if ((*(ushort *)&args->field_0x10 >> 3 & 1) != 0) {
            raviX_output_linearizer(lVar4,_stdout);
          }
          raviX_construct_cfg(*(undefined8 *)(lVar4 + 8));
          if (((*(ushort *)&args->field_0x10 >> 4 & 1) != 0) &&
             ((*(ushort *)&args->field_0x10 >> 7 & 1) == 0)) {
            raviX_output_cfg(*(undefined8 *)(lVar4 + 8),_stdout);
          }
          if ((*(ushort *)&args->field_0x10 >> 7 & 1) != 0) {
            raviX_remove_unreachable_blocks(lVar4);
            if ((*(ushort *)&args->field_0x10 >> 3 & 1) != 0) {
              raviX_output_linearizer(lVar4,_stdout);
            }
            if ((*(ushort *)&args->field_0x10 >> 4 & 1) != 0) {
              raviX_output_cfg(*(undefined8 *)(lVar4 + 8),_stdout);
            }
          }
          if (((*(ushort *)&args->field_0x10 >> 9 & 1) != 0) &&
             (raviX_optimize_upvalues(lVar4), (*(ushort *)&args->field_0x10 >> 3 & 1) != 0)) {
            raviX_output_linearizer(lVar4,_stdout);
          }
          if ((*(ushort *)&args->field_0x10 >> 8 & 1) != 0) {
            fprintf(_stdout,"\n#endif\n");
            raviX_generate_C_tofile(lVar4,args->mainfunc,_stdout);
          }
        }
        else {
          uVar3 = raviX_get_last_error(compiler_state_00);
          fprintf(pFVar1,"%s\n",uVar3);
        }
        raviX_destroy_linearizer(lVar4);
      }
      else {
        uVar3 = raviX_get_last_error(compiler_state_00);
        fprintf(pFVar1,"%s\n",uVar3);
      }
    }
    else {
      uVar3 = raviX_get_last_error(compiler_state_00);
      fprintf(pFVar1,"%s\n",uVar3);
    }
  }
  else {
    uVar3 = raviX_get_last_error(compiler_state_00);
    fprintf(pFVar1,"%s\n",uVar3);
  }
LAB_00102ab4:
  raviX_destroy_compiler(compiler_state_00);
  fflush(_stdout);
  return compiler_state._4_4_;
}

Assistant:

static int do_code(C_MemoryAllocator *allocator, const char *code, const struct arguments *args)
{
	int rc = 0;

	if (args->gen_C) {
		fprintf(stdout, "#if 0\n");
	}
	if (args->codump) {
		printf("%s\n", code);
	}

	CompilerState *compiler_state = raviX_init_compiler(allocator);
	rc = raviX_parse(compiler_state, code, strlen(code), "input");
	if (rc != 0) {
		fprintf(stderr, "%s\n", raviX_get_last_error(compiler_state));
		goto L_exit;
	}
	output_ast(compiler_state, args);
	rc = raviX_ast_lower(compiler_state);
	if (rc != 0) {
		fprintf(stderr, "%s\n", raviX_get_last_error(compiler_state));
		goto L_exit;
	}
	rc = raviX_ast_typecheck(compiler_state);
	if (rc != 0) {
		fprintf(stderr, "%s\n", raviX_get_last_error(compiler_state));
		goto L_exit;
	}
	output_ast(compiler_state, args);
	if (args->simplify_ast) {
		rc = raviX_ast_simplify(compiler_state);
		if (rc != 0) {
			fprintf(stderr, "%s\n", raviX_get_last_error(compiler_state));
			goto L_exit;
		}
		output_ast(compiler_state, args);
	}
	LinearizerState *linearizer = raviX_init_linearizer(compiler_state);
	rc = raviX_ast_linearize(linearizer);
	if (rc != 0) {
		fprintf(stderr, "%s\n", raviX_get_last_error(compiler_state));
		goto L_linend;
	}
	if (args->irdump) {
		raviX_output_linearizer(linearizer, stdout);
	}
	raviX_construct_cfg(linearizer->main_proc);
	if (args->cfgdump &&
	    !args->remove_unreachable_blocks) { // Only dump out final CFG for now as we need it as clean output
		raviX_output_cfg(linearizer->main_proc, stdout);
	}
	if (args->remove_unreachable_blocks) {
		raviX_remove_unreachable_blocks(linearizer);
		if (args->irdump) {
			raviX_output_linearizer(linearizer, stdout);
		}
		if (args->cfgdump) {
			raviX_output_cfg(linearizer->main_proc, stdout);
		}
	}
	if (args->opt_upvalue) {
		raviX_optimize_upvalues(linearizer);
		if (args->irdump) {
			raviX_output_linearizer(linearizer, stdout);
		}
	}
	if (args->gen_C) {
		fprintf(stdout, "\n#endif\n");
		raviX_generate_C_tofile(linearizer, args->mainfunc, stdout);
	}

L_linend:
	raviX_destroy_linearizer(linearizer);

L_exit:
	raviX_destroy_compiler(compiler_state);
	fflush(stdout);

	return rc;
}